

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O2

ssize_t phr_decode_chunked(phr_chunked_decoder *decoder,char *buf,size_t *_bufsz)

{
  char *pcVar1;
  size_t sVar2;
  ssize_t sVar3;
  char cVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  ulong __n;
  size_t sVar8;
  ulong __n_00;
  size_t sVar9;
  
  sVar2 = *_bufsz;
  cVar4 = decoder->_state;
  sVar9 = 0;
  sVar8 = 0;
LAB_00107bec:
  switch(cVar4) {
  case '\0':
    do {
      if (sVar2 == sVar9) goto LAB_00107d5a;
      iVar6 = (int)buf[sVar9];
      uVar7 = iVar6 - 0x30;
      if (9 < uVar7) {
        if (iVar6 - 0x41U < 6) {
          uVar7 = iVar6 - 0x37;
        }
        else {
          if (iVar6 - 0x67U < 0xfffffffa) goto LAB_00107cab;
          uVar7 = iVar6 - 0x57;
        }
      }
      if (decoder->_hex_count == '\x10') goto LAB_00107d5f;
      decoder->bytes_left_in_chunk = (long)(int)uVar7 + decoder->bytes_left_in_chunk * 0x10;
      decoder->_hex_count = decoder->_hex_count + '\x01';
      sVar9 = sVar9 + 1;
    } while( true );
  case '\x01':
    goto switchD_00107bff_caseD_1;
  case '\x02':
    __n = decoder->bytes_left_in_chunk;
    goto LAB_00107ce6;
  case '\x03':
    goto switchD_00107bff_caseD_3;
  case '\x04':
    do {
      if (sVar2 == sVar9) goto LAB_00107d5a;
      pcVar1 = buf + sVar9;
      sVar9 = sVar9 + 1;
    } while (*pcVar1 == '\r');
    if (*pcVar1 != '\n') {
      decoder->_state = '\x05';
      goto switchD_00107bff_caseD_5;
    }
    goto LAB_00107d64;
  case '\x05':
switchD_00107bff_caseD_5:
    sVar5 = sVar9;
    do {
      if (sVar2 == sVar5) goto LAB_00107d5a;
      sVar9 = sVar5 + 1;
      pcVar1 = buf + sVar5;
      sVar5 = sVar9;
    } while (*pcVar1 != '\n');
    cVar4 = '\x04';
    break;
  default:
    __assert_fail("!\"decoder is corrupt\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/clask/../clask/picohttpparser.c"
                  ,0x275,
                  "ssize_t phr_decode_chunked(struct phr_chunked_decoder *, char *, size_t *)");
  }
  goto LAB_00107d52;
LAB_00107d5a:
  sVar3 = -2;
  sVar9 = sVar2;
  goto LAB_00107d6a;
LAB_00107cab:
  if (decoder->_hex_count != '\0') {
    decoder->_hex_count = '\0';
    decoder->_state = '\x01';
switchD_00107bff_caseD_1:
    sVar5 = sVar9;
    do {
      if (sVar2 == sVar5) goto LAB_00107d5a;
      sVar9 = sVar5 + 1;
      pcVar1 = buf + sVar5;
      sVar5 = sVar9;
    } while (*pcVar1 != '\n');
    __n = decoder->bytes_left_in_chunk;
    if (__n == 0) {
      cVar4 = '\x04';
      if (decoder->consume_trailer != '\0') {
LAB_00107d52:
        decoder->_state = cVar4;
        goto LAB_00107bec;
      }
LAB_00107d64:
      sVar3 = sVar2 - sVar9;
      goto LAB_00107d6a;
    }
    decoder->_state = '\x02';
LAB_00107ce6:
    __n_00 = sVar2 - sVar9;
    if (__n_00 < __n) {
      if (sVar8 != sVar9) {
        memmove(buf + sVar8,buf + sVar9,__n_00);
        __n = decoder->bytes_left_in_chunk;
      }
      sVar3 = -2;
      decoder->bytes_left_in_chunk = __n - __n_00;
      sVar8 = sVar8 + __n_00;
      sVar9 = sVar2;
      goto LAB_00107d6a;
    }
    if (sVar8 != sVar9) {
      memmove(buf + sVar8,buf + sVar9,__n);
      __n = decoder->bytes_left_in_chunk;
    }
    decoder->bytes_left_in_chunk = 0;
    sVar9 = sVar9 + __n;
    decoder->_state = '\x03';
    sVar8 = sVar8 + __n;
switchD_00107bff_caseD_3:
    while( true ) {
      if (sVar2 == sVar9) goto LAB_00107d5a;
      if (buf[sVar9] != '\r') break;
      sVar9 = sVar9 + 1;
    }
    if (buf[sVar9] == '\n') {
      sVar9 = sVar9 + 1;
      cVar4 = '\0';
      goto LAB_00107d52;
    }
  }
LAB_00107d5f:
  sVar3 = -1;
LAB_00107d6a:
  if (sVar8 != sVar9) {
    memmove(buf + sVar8,buf + sVar9,sVar2 - sVar9);
  }
  *_bufsz = sVar8;
  return sVar3;
}

Assistant:

ssize_t phr_decode_chunked(struct phr_chunked_decoder *decoder, char *buf, size_t *_bufsz)
{
    size_t dst = 0, src = 0, bufsz = *_bufsz;
    ssize_t ret = -2; /* incomplete */

    while (1) {
        switch (decoder->_state) {
        case CHUNKED_IN_CHUNK_SIZE:
            for (;; ++src) {
                int v;
                if (src == bufsz)
                    goto Exit;
                if ((v = decode_hex(buf[src])) == -1) {
                    if (decoder->_hex_count == 0) {
                        ret = -1;
                        goto Exit;
                    }
                    break;
                }
                if (decoder->_hex_count == sizeof(size_t) * 2) {
                    ret = -1;
                    goto Exit;
                }
                decoder->bytes_left_in_chunk = decoder->bytes_left_in_chunk * 16 + v;
                ++decoder->_hex_count;
            }
            decoder->_hex_count = 0;
            decoder->_state = CHUNKED_IN_CHUNK_EXT;
        /* fallthru */
        case CHUNKED_IN_CHUNK_EXT:
            /* RFC 7230 A.2 "Line folding in chunk extensions is disallowed" */
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] == '\012')
                    break;
            }
            ++src;
            if (decoder->bytes_left_in_chunk == 0) {
                if (decoder->consume_trailer) {
                    decoder->_state = CHUNKED_IN_TRAILERS_LINE_HEAD;
                    break;
                } else {
                    goto Complete;
                }
            }
            decoder->_state = CHUNKED_IN_CHUNK_DATA;
        /* fallthru */
        case CHUNKED_IN_CHUNK_DATA: {
            size_t avail = bufsz - src;
            if (avail < decoder->bytes_left_in_chunk) {
                if (dst != src)
                    memmove(buf + dst, buf + src, avail);
                src += avail;
                dst += avail;
                decoder->bytes_left_in_chunk -= avail;
                goto Exit;
            }
            if (dst != src)
                memmove(buf + dst, buf + src, decoder->bytes_left_in_chunk);
            src += decoder->bytes_left_in_chunk;
            dst += decoder->bytes_left_in_chunk;
            decoder->bytes_left_in_chunk = 0;
            decoder->_state = CHUNKED_IN_CHUNK_CRLF;
        }
        /* fallthru */
        case CHUNKED_IN_CHUNK_CRLF:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] != '\015')
                    break;
            }
            if (buf[src] != '\012') {
                ret = -1;
                goto Exit;
            }
            ++src;
            decoder->_state = CHUNKED_IN_CHUNK_SIZE;
            break;
        case CHUNKED_IN_TRAILERS_LINE_HEAD:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] != '\015')
                    break;
            }
            if (buf[src++] == '\012')
                goto Complete;
            decoder->_state = CHUNKED_IN_TRAILERS_LINE_MIDDLE;
        /* fallthru */
        case CHUNKED_IN_TRAILERS_LINE_MIDDLE:
            for (;; ++src) {
                if (src == bufsz)
                    goto Exit;
                if (buf[src] == '\012')
                    break;
            }
            ++src;
            decoder->_state = CHUNKED_IN_TRAILERS_LINE_HEAD;
            break;
        default:
            assert(!"decoder is corrupt");
        }
    }

Complete:
    ret = bufsz - src;
Exit:
    if (dst != src)
        memmove(buf + dst, buf + src, bufsz - src);
    *_bufsz = dst;
    return ret;
}